

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::relative_pose::modules::fivept_kneip::groebnerRow48_000000000_f
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  double factor;
  Index in_stack_fffffffffffffd88;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *in_stack_fffffffffffffd90;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,0xffb3f0);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb411);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb43e);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb46c);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb490);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *pSVar2;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar41,auVar78);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb4e6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb50a);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *pSVar2;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar42,auVar79);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb560);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb584);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *pSVar2;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar43,auVar80);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb5da);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb5fe);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *pSVar2;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar44,auVar81);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb654);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb678);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *pSVar2;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar45,auVar82);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb6ce);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb6f2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *pSVar2;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar46,auVar83);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb748);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb76c);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *pSVar2;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar47,auVar84);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb7c5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb7ec);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *pSVar2;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar48,auVar85);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb84b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb872);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SVar1;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *pSVar2;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar12,auVar49,auVar86);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb8d1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb8f8);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SVar1;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *pSVar2;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar13,auVar50,auVar87);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb957);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb97e);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = SVar1;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *pSVar2;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar14,auVar51,auVar88);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffb9dd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffba04);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = SVar1;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *pSVar2;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar15,auVar52,auVar89);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffba63);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffba8a);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = SVar1;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *pSVar2;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar16,auVar53,auVar90);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbae9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbb10);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = SVar1;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *pSVar2;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar17,auVar54,auVar91);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbb6f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbb96);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = SVar1;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *pSVar2;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar18,auVar55,auVar92);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbbf5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbc1c);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = SVar1;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *pSVar2;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar19,auVar56,auVar93);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbc7b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbca2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = SVar1;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *pSVar2;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar20,auVar57,auVar94);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbd01);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbd28);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = SVar1;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *pSVar2;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar21,auVar58,auVar95);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbd87);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbdae);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = SVar1;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *pSVar2;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar22,auVar59,auVar96);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbe0d);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbe34);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = SVar1;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *pSVar2;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar23,auVar60,auVar97);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbe93);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbeba);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = SVar1;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *pSVar2;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar24,auVar61,auVar98);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbf19);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbf40);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = SVar1;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *pSVar2;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar25,auVar62,auVar99);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbf9f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffbfc6);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = SVar1;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *pSVar2;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar26,auVar63,auVar100);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc025);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc04c);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = SVar1;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *pSVar2;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar27,auVar64,auVar101);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc0ab);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc0d2);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = SVar1;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *pSVar2;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar28,auVar65,auVar102);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc131);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc158);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = SVar1;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *pSVar2;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar29,auVar66,auVar103);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc1b7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc1de);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = SVar1;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *pSVar2;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar30,auVar67,auVar104);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc23d);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc264);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = SVar1;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *pSVar2;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar31,auVar68,auVar105);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc2c3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc2ea);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = SVar1;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *pSVar2;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar32,auVar69,auVar106);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc349);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc370);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = SVar1;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *pSVar2;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar33,auVar70,auVar107);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc3cf);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc3f6);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = SVar1;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *pSVar2;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar34,auVar71,auVar108);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc455);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc47c);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = SVar1;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *pSVar2;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar35,auVar72,auVar109);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc4db);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc502);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = SVar1;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *pSVar2;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar36,auVar73,auVar110);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc561);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc588);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = SVar1;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *pSVar2;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar37,auVar74,auVar111);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc5e7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc60e);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = SVar1;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *pSVar2;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar38,auVar75,auVar112);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc66d);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc694);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = SVar1;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *pSVar2;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar39,auVar76,auVar113);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc6f3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd88,0xffc71a);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = SVar1;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *pSVar2;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar40,auVar77,auVar114);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::groebnerRow48_000000000_f( Eigen::Matrix<double,66,197> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,128) / groebnerMatrix(48,128);
  groebnerMatrix(targetRow,128) = 0.0;
  groebnerMatrix(targetRow,129) -= factor * groebnerMatrix(48,129);
  groebnerMatrix(targetRow,131) -= factor * groebnerMatrix(48,131);
  groebnerMatrix(targetRow,132) -= factor * groebnerMatrix(48,132);
  groebnerMatrix(targetRow,133) -= factor * groebnerMatrix(48,133);
  groebnerMatrix(targetRow,134) -= factor * groebnerMatrix(48,134);
  groebnerMatrix(targetRow,135) -= factor * groebnerMatrix(48,135);
  groebnerMatrix(targetRow,136) -= factor * groebnerMatrix(48,136);
  groebnerMatrix(targetRow,137) -= factor * groebnerMatrix(48,137);
  groebnerMatrix(targetRow,138) -= factor * groebnerMatrix(48,138);
  groebnerMatrix(targetRow,139) -= factor * groebnerMatrix(48,139);
  groebnerMatrix(targetRow,140) -= factor * groebnerMatrix(48,140);
  groebnerMatrix(targetRow,141) -= factor * groebnerMatrix(48,141);
  groebnerMatrix(targetRow,170) -= factor * groebnerMatrix(48,170);
  groebnerMatrix(targetRow,171) -= factor * groebnerMatrix(48,171);
  groebnerMatrix(targetRow,173) -= factor * groebnerMatrix(48,173);
  groebnerMatrix(targetRow,174) -= factor * groebnerMatrix(48,174);
  groebnerMatrix(targetRow,176) -= factor * groebnerMatrix(48,176);
  groebnerMatrix(targetRow,177) -= factor * groebnerMatrix(48,177);
  groebnerMatrix(targetRow,178) -= factor * groebnerMatrix(48,178);
  groebnerMatrix(targetRow,179) -= factor * groebnerMatrix(48,179);
  groebnerMatrix(targetRow,180) -= factor * groebnerMatrix(48,180);
  groebnerMatrix(targetRow,181) -= factor * groebnerMatrix(48,181);
  groebnerMatrix(targetRow,182) -= factor * groebnerMatrix(48,182);
  groebnerMatrix(targetRow,183) -= factor * groebnerMatrix(48,183);
  groebnerMatrix(targetRow,184) -= factor * groebnerMatrix(48,184);
  groebnerMatrix(targetRow,185) -= factor * groebnerMatrix(48,185);
  groebnerMatrix(targetRow,186) -= factor * groebnerMatrix(48,186);
  groebnerMatrix(targetRow,187) -= factor * groebnerMatrix(48,187);
  groebnerMatrix(targetRow,188) -= factor * groebnerMatrix(48,188);
  groebnerMatrix(targetRow,189) -= factor * groebnerMatrix(48,189);
  groebnerMatrix(targetRow,190) -= factor * groebnerMatrix(48,190);
  groebnerMatrix(targetRow,191) -= factor * groebnerMatrix(48,191);
  groebnerMatrix(targetRow,192) -= factor * groebnerMatrix(48,192);
  groebnerMatrix(targetRow,193) -= factor * groebnerMatrix(48,193);
  groebnerMatrix(targetRow,194) -= factor * groebnerMatrix(48,194);
  groebnerMatrix(targetRow,195) -= factor * groebnerMatrix(48,195);
  groebnerMatrix(targetRow,196) -= factor * groebnerMatrix(48,196);
}